

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<std::pair<QString,_QString>_>::moveAppend
          (QGenericArrayOps<std::pair<QString,_QString>_> *this,pair<QString,_QString> *b,
          pair<QString,_QString> *e)

{
  pair<QString,_QString> *ppVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  qsizetype qVar5;
  
  if ((b != e) && (b < e)) {
    ppVar1 = (this->super_QArrayDataPointer<std::pair<QString,_QString>_>).ptr;
    qVar5 = (this->super_QArrayDataPointer<std::pair<QString,_QString>_>).size;
    do {
      pDVar2 = (b->first).d.d;
      (b->first).d.d = (Data *)0x0;
      ppVar1[qVar5].first.d.d = pDVar2;
      pcVar3 = (b->first).d.ptr;
      (b->first).d.ptr = (char16_t *)0x0;
      ppVar1[qVar5].first.d.ptr = pcVar3;
      qVar4 = (b->first).d.size;
      (b->first).d.size = 0;
      ppVar1[qVar5].first.d.size = qVar4;
      pDVar2 = (b->second).d.d;
      (b->second).d.d = (Data *)0x0;
      ppVar1[qVar5].second.d.d = pDVar2;
      pcVar3 = (b->second).d.ptr;
      (b->second).d.ptr = (char16_t *)0x0;
      ppVar1[qVar5].second.d.ptr = pcVar3;
      qVar4 = (b->second).d.size;
      (b->second).d.size = 0;
      ppVar1[qVar5].second.d.size = qVar4;
      b = b + 1;
      qVar5 = (this->super_QArrayDataPointer<std::pair<QString,_QString>_>).size + 1;
      (this->super_QArrayDataPointer<std::pair<QString,_QString>_>).size = qVar5;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }